

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_dictMatchState_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  long *plVar1;
  undefined8 *puVar2;
  U32 UVar3;
  ZSTD_matchState_t *pZVar4;
  U32 *pUVar5;
  seqDef *psVar6;
  ulong uVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  BYTE *pBVar15;
  int *mEnd;
  ulong uVar16;
  long lVar17;
  BYTE *pBVar18;
  BYTE *pBVar19;
  int *ip;
  seqStore_t *psVar20;
  int *piVar21;
  uint *puVar22;
  uint local_d8;
  uint local_d4;
  int *local_d0;
  size_t offbaseFound;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  BYTE *local_a8;
  int *local_a0;
  ulong local_98;
  BYTE *local_90;
  ulong local_88;
  ulong local_80;
  BYTE *local_78;
  int *local_70;
  BYTE *local_68;
  int *local_60;
  int local_54;
  seqStore_t *local_50;
  uint *local_48;
  size_t local_40;
  BYTE *local_38;
  
  local_90 = (ms->window).base;
  local_b0 = (ms->cParams).minMatch;
  if (5 < local_b0) {
    local_b0 = 6;
  }
  if (local_b0 < 5) {
    local_b0 = 4;
  }
  local_b4 = (ms->cParams).searchLog;
  local_b8 = 6;
  if (local_b4 < 6) {
    local_b8 = local_b4;
  }
  local_ac = (ms->window).dictLimit;
  local_98 = (ulong)local_ac;
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  local_78 = local_90 + local_98;
  pZVar4 = ms->dictMatchState;
  local_68 = (pZVar4->window).base;
  local_38 = local_68 + (pZVar4->window).dictLimit;
  local_70 = (int *)(pZVar4->window).nextSrc;
  uVar9 = ((int)src - ((int)local_38 + (int)local_78)) + (int)local_70;
  ip = (int *)((long)src + (ulong)(uVar9 == 0));
  local_d4 = *rep;
  if (uVar9 < local_d4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_d8 = rep[1];
  local_50 = seqStore;
  local_48 = rep;
  if (uVar9 < local_d8) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 0x10));
  local_ac = ((int)local_68 - (int)local_70) + local_ac;
  ms->lazySkipping = 0;
  piVar21 = (int *)(ulong)ms->nextToUpdate;
  UVar3 = ms->rowHashLog;
  uVar9 = ((int)local_60 - (int)(local_90 + (long)piVar21)) + 1;
  if (7 < uVar9) {
    uVar9 = 8;
  }
  uVar11 = 0;
  if (local_90 + (long)piVar21 <= local_60) {
    uVar11 = uVar9;
  }
  pUVar5 = ms->hashTable;
  local_a0 = (int *)(ulong)(uVar11 + ms->nextToUpdate);
  local_a8 = (BYTE *)(ulong)(0x38 - UVar3);
  local_80 = CONCAT44(local_80._4_4_,0x18 - UVar3);
  local_40 = 1L << ((byte)local_b8 & 0x3f);
  pBVar18 = ms->tagTable;
  for (; piVar21 < local_a0; piVar21 = (int *)((long)piVar21 + 1)) {
    if (0x20 < UVar3 + 8) {
LAB_0015a64f:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_90 + (long)piVar21);
    uVar14 = ms->hashSalt;
    if (local_b0 == 5) {
      sVar13 = (*plVar1 * -0x30e4432345000000 ^ uVar14) >> ((byte)local_a8 & 0x3f);
    }
    else if (local_b0 == 6) {
      sVar13 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar14);
    }
    else {
      sVar13 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar14) >> ((byte)local_80 & 0x1f));
    }
    uVar9 = ((uint)(sVar13 >> 8) & 0xffffff) << ((byte)local_b8 & 0x1f);
    if (((ulong)(pUVar5 + uVar9) & 0x3f) != 0) {
LAB_0015a66e:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar10 = ZSTD_isAligned(pBVar18 + uVar9,local_40);
    if (iVar10 == 0) {
LAB_0015a68d:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    ms->hashCache[(uint)piVar21 & 7] = (U32)sVar13;
  }
  local_a8 = local_68 + -(ulong)local_ac;
  local_a0 = iEnd + -8;
  uVar14 = local_98;
  uVar9 = local_b8;
  local_d0 = (int *)src;
  puVar22 = local_48;
  psVar20 = local_50;
  pBVar18 = local_90;
LAB_00159fc1:
  do {
    uVar7 = local_98;
    if (local_60 <= ip) {
      *puVar22 = local_d4;
      puVar22[1] = local_d8;
      return (long)iEnd - (long)local_d0;
    }
    uVar11 = (((int)ip - (int)pBVar18) - local_d4) + 1;
    uVar12 = (uint)uVar14;
    if (uVar11 - uVar12 < 0xfffffffd) {
      piVar21 = (int *)(pBVar18 + uVar11);
      if (uVar11 < uVar12) {
        piVar21 = (int *)(local_68 + (uVar11 - local_ac));
      }
      if (*piVar21 != *(int *)((long)ip + 1)) goto LAB_0015a00e;
      mEnd = iEnd;
      if (uVar11 < uVar12) {
        mEnd = local_70;
      }
      sVar13 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),(BYTE *)(piVar21 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                          local_78);
      uVar14 = sVar13 + 4;
      ip = (int *)((long)ip + 1);
      sVar13 = 1;
LAB_0015a1e9:
      if (psVar20->maxNbSeq <=
          (ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart >> 3)) {
LAB_0015a6ac:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_88 = uVar14;
      if (0x20000 < psVar20->maxNbLit) {
LAB_0015a709:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar14 = (long)ip - (long)local_d0;
      pBVar19 = psVar20->lit;
      if (psVar20->litStart + psVar20->maxNbLit < pBVar19 + uVar14) {
LAB_0015a728:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < ip) {
LAB_0015a6ea:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_a0 < ip) {
        ZSTD_safecopyLiterals(pBVar19,(BYTE *)local_d0,(BYTE *)ip,(BYTE *)local_a0);
LAB_0015a255:
        psVar20->lit = psVar20->lit + uVar14;
        if (0xffff < uVar14) {
          if (psVar20->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar20->longLengthType = ZSTD_llt_literalLength;
          psVar20->longLengthPos =
               (U32)((ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = *(undefined8 *)(local_d0 + 2);
        *(undefined8 *)pBVar19 = *(undefined8 *)local_d0;
        *(undefined8 *)(pBVar19 + 8) = uVar8;
        pBVar19 = psVar20->lit;
        if (0x10 < uVar14) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar19 + 0x10 + (-0x10 - (long)(local_d0 + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar8 = *(undefined8 *)(local_d0 + 6);
          *(undefined8 *)(pBVar19 + 0x10) = *(undefined8 *)(local_d0 + 4);
          *(undefined8 *)(pBVar19 + 0x18) = uVar8;
          if (0x20 < (long)uVar14) {
            lVar17 = 0;
            do {
              puVar2 = (undefined8 *)((long)local_d0 + lVar17 + 0x20);
              uVar8 = puVar2[1];
              pBVar15 = pBVar19 + lVar17 + 0x20;
              *(undefined8 *)pBVar15 = *puVar2;
              *(undefined8 *)(pBVar15 + 8) = uVar8;
              puVar2 = (undefined8 *)((long)local_d0 + lVar17 + 0x30);
              uVar8 = puVar2[1];
              *(undefined8 *)(pBVar15 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar15 + 0x18) = uVar8;
              lVar17 = lVar17 + 0x20;
            } while (pBVar15 + 0x20 < pBVar19 + uVar14);
          }
          goto LAB_0015a255;
        }
        psVar20->lit = pBVar19 + uVar14;
      }
      psVar6 = psVar20->sequences;
      psVar6->litLength = (U16)uVar14;
      psVar6->offBase = (U32)sVar13;
      if (local_88 < 3) {
LAB_0015a6cb:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < local_88 - 3) {
        if (psVar20->longLengthType != ZSTD_llt_none) {
LAB_0015a747:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar20->longLengthType = ZSTD_llt_matchLength;
        psVar20->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar20->sequencesStart) >> 3);
      }
      psVar6->mlBase = (U16)(local_88 - 3);
      psVar20->sequences = psVar6 + 1;
      if (ms->lazySkipping != 0) {
        uVar9 = ms->nextToUpdate;
        uVar14 = (ulong)uVar9;
        UVar3 = ms->rowHashLog;
        uVar11 = ((int)local_60 - (int)(pBVar18 + uVar14)) + 1;
        if (7 < uVar11) {
          uVar11 = 8;
        }
        if (local_60 < pBVar18 + uVar14) {
          uVar11 = 0;
        }
        pUVar5 = ms->hashTable;
        pBVar18 = ms->tagTable;
        local_80 = (ulong)(0x38 - UVar3);
        local_54 = 0x18 - UVar3;
        for (; uVar14 < uVar11 + uVar9; uVar14 = uVar14 + 1) {
          if (0x20 < UVar3 + 8) goto LAB_0015a64f;
          plVar1 = (long *)(local_90 + uVar14);
          uVar7 = ms->hashSalt;
          if (local_b0 == 5) {
            sVar13 = (*plVar1 * -0x30e4432345000000 ^ uVar7) >> ((byte)local_80 & 0x3f);
          }
          else if (local_b0 == 6) {
            sVar13 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar7);
          }
          else {
            sVar13 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar7) >> ((byte)local_54 & 0x1f))
            ;
          }
          uVar12 = ((uint)(sVar13 >> 8) & 0xffffff) << ((byte)local_b8 & 0x1f);
          if (((ulong)(pUVar5 + uVar12) & 0x3f) != 0) goto LAB_0015a66e;
          iVar10 = ZSTD_isAligned(pBVar18 + uVar12,local_40);
          if (iVar10 == 0) goto LAB_0015a68d;
          ms->hashCache[(uint)uVar14 & 7] = (U32)sVar13;
        }
        ms->lazySkipping = 0;
        pBVar18 = local_90;
        psVar20 = local_50;
        puVar22 = local_48;
      }
      uVar9 = local_d8;
      for (ip = (int *)((long)ip + local_88); local_d8 = uVar9, uVar14 = local_98, uVar9 = local_b8,
          local_d0 = ip, ip <= local_60; ip = (int *)((long)ip + sVar13 + 4)) {
        uVar11 = ((int)ip - (int)pBVar18) - local_d8;
        uVar12 = (uint)local_98;
        pBVar19 = pBVar18;
        if (uVar11 < uVar12) {
          pBVar19 = local_a8;
        }
        if ((0xfffffffc < uVar11 - uVar12) || (*(int *)(pBVar19 + uVar11) != *ip)) break;
        piVar21 = iEnd;
        if (uVar11 < uVar12) {
          piVar21 = local_70;
        }
        sVar13 = ZSTD_count_2segments
                           ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar19 + uVar11) + 4),(BYTE *)iEnd,
                            (BYTE *)piVar21,local_78);
        if (psVar20->maxNbSeq <=
            (ulong)((long)psVar20->sequences - (long)psVar20->sequencesStart >> 3))
        goto LAB_0015a6ac;
        if (0x20000 < psVar20->maxNbLit) goto LAB_0015a709;
        pBVar19 = psVar20->lit;
        if (psVar20->litStart + psVar20->maxNbLit < pBVar19) goto LAB_0015a728;
        if (iEnd < ip) goto LAB_0015a6ea;
        if (local_a0 < ip) {
          ZSTD_safecopyLiterals(pBVar19,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_a0);
        }
        else {
          uVar8 = *(undefined8 *)(ip + 2);
          *(undefined8 *)pBVar19 = *(undefined8 *)ip;
          *(undefined8 *)(pBVar19 + 8) = uVar8;
        }
        psVar6 = psVar20->sequences;
        psVar6->litLength = 0;
        psVar6->offBase = 1;
        if (sVar13 + 4 < 3) goto LAB_0015a6cb;
        if (0xffff < sVar13 + 1) {
          if (psVar20->longLengthType != ZSTD_llt_none) goto LAB_0015a747;
          psVar20->longLengthType = ZSTD_llt_matchLength;
          psVar20->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar20->sequencesStart) >> 3)
          ;
        }
        psVar6->mlBase = (U16)(sVar13 + 1);
        psVar20->sequences = psVar6 + 1;
        uVar9 = local_d4;
        local_d4 = local_d8;
      }
      goto LAB_00159fc1;
    }
LAB_0015a00e:
    offbaseFound = 999999999;
    if (local_b0 == 6) {
      if (uVar9 == 6) {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_6_6(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar9 == 5) {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_6_5(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_6_4(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
    }
    else if (local_b0 == 5) {
      if (uVar9 == 6) {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_5_6(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar9 == 5) {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_5_5(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar14 = ZSTD_RowFindBestMatch_dictMatchState_5_4(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
    }
    else if (uVar9 == 6) {
      uVar14 = ZSTD_RowFindBestMatch_dictMatchState_4_6(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
    }
    else if (uVar9 == 5) {
      uVar14 = ZSTD_RowFindBestMatch_dictMatchState_4_5(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
    }
    else {
      uVar14 = ZSTD_RowFindBestMatch_dictMatchState_4_4(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
    }
    if (3 < uVar14) {
      sVar13 = offbaseFound;
      if (3 < offbaseFound) {
        uVar16 = (long)ip + (-(long)pBVar18 - offbaseFound) + -0xfffffffd;
        pBVar15 = pBVar18;
        pBVar19 = local_78;
        if ((uint)uVar16 < (uint)uVar7) {
          pBVar15 = local_a8;
          pBVar19 = local_38;
        }
        pBVar15 = pBVar15 + (uVar16 & 0xffffffff);
        for (; ((local_d0 < ip && (pBVar19 < pBVar15)) && (*(BYTE *)((long)ip + -1) == pBVar15[-1]))
            ; ip = (int *)((long)ip + -1)) {
          pBVar15 = pBVar15 + -1;
          uVar14 = uVar14 + 1;
        }
        local_d8 = local_d4;
        local_d4 = (int)offbaseFound - 3;
      }
      goto LAB_0015a1e9;
    }
    uVar14 = (long)ip - (long)local_d0;
    ip = (int *)((long)ip + (uVar14 >> 8) + 1);
    ms->lazySkipping = (uint)(0x7ff < uVar14);
    uVar14 = uVar7;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_dictMatchState_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0, ZSTD_dictMatchState);
}